

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scanner.cpp
# Opt level: O0

void __thiscall Scanner::Scanner(Scanner *this)

{
  allocator<Lex> local_2d [17];
  Lex local_1c;
  Scanner *local_10;
  Scanner *this_local;
  
  local_10 = this;
  std::__cxx11::string::string((string *)&this->buffer);
  Lex::Lex(&local_1c);
  std::allocator<Lex>::allocator(local_2d);
  std::vector<Lex,_std::allocator<Lex>_>::vector(&this->lex_vec,0,&local_1c,local_2d);
  std::allocator<Lex>::~allocator(local_2d);
  Lex::~Lex(&local_1c);
  clear_buffer(this);
  this->STATE = H_ST;
  return;
}

Assistant:

Scanner::Scanner(): lex_vec(0, Lex()) {
    clear_buffer();
    STATE = H_ST;
}